

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O0

int stumplog_set_mask(int mask)

{
  stumpless_target *target_00;
  int old_mask;
  stumpless_target *target;
  int mask_local;
  
  target_00 = stumpless_get_current_target();
  if (target_00 == (stumpless_target *)0x0) {
    target._4_4_ = 0;
  }
  else {
    lock_target(target_00);
    target._4_4_ = target_00->mask;
    target_00->mask = mask;
    unlock_target(target_00);
  }
  return target._4_4_;
}

Assistant:

int
stumplog_set_mask( int mask ) {
  struct stumpless_target *target;
  int old_mask;

  target = stumpless_get_current_target(  );
  if( !target ) {
    return 0;
  }

  lock_target( target );
  old_mask = target->mask;
  target->mask = mask;
  unlock_target( target );

  return old_mask;
}